

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_catalog_set.cpp
# Opt level: O3

EntryLookup __thiscall
duckdb::DependencyCatalogSet::GetEntryDetailed
          (DependencyCatalogSet *this,CatalogTransaction transaction,MangledEntryName *name)

{
  EntryLookup EVar1;
  EntryLookup EVar2;
  MangledDependencyName new_name;
  string local_38;
  
  MangledDependencyName::MangledDependencyName
            ((MangledDependencyName *)&local_38,&this->mangled_name,name);
  EVar1 = CatalogSet::GetEntryDetailed(this->set,transaction,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  EVar2._12_4_ = 0;
  EVar2.result.ptr = (CatalogEntry *)SUB128(EVar1._0_12_,0);
  EVar2.reason = SUB124(EVar1._0_12_,8);
  return EVar2;
}

Assistant:

CatalogSet::EntryLookup DependencyCatalogSet::GetEntryDetailed(CatalogTransaction transaction,
                                                               const MangledEntryName &name) {
	auto new_name = ApplyPrefix(name);
	return set.GetEntryDetailed(transaction, new_name.name);
}